

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_nest(chunk *c,loc_conflict centre,wchar_t rating)

{
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  monster_race *pmVar6;
  wchar_t wVar7;
  bool bVar8;
  loc_conflict grid;
  wchar_t x1;
  long lVar9;
  int iVar10;
  int iVar11;
  wchar_t local_268;
  loc_conflict centre_local;
  monster_race *what [64];
  
  centre_local = centre;
  uVar2 = Rand_div(4);
  wVar7 = uVar2 * 2 + L'\r';
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',wVar7);
  local_268 = centre.y;
  if ((c->height <= local_268) || (c->width <= centre.x)) {
    _Var1 = find_space(&centre_local,L'\v',wVar7);
    if (!_Var1) {
      return false;
    }
    centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
    local_268 = centre_local.y;
  }
  iVar3 = (int)(uVar2 * 2 + 0xb) / 2;
  iVar10 = centre.x;
  x1 = iVar10 - iVar3;
  wVar7 = iVar10 + iVar3 + L'\x01';
  generate_room(c,local_268 + L'\xfffffffb',x1 + L'\xffffffff',local_268 + L'\x05',wVar7,L'\0');
  draw_rectangle(c,local_268 + L'\xfffffffb',x1 + L'\xffffffff',local_268 + L'\x05',wVar7,L'\x15',
                 L'\f',false);
  fill_rectangle(c,local_268 + L'\xfffffffc',x1,local_268 + L'\x04',iVar10 + iVar3,L'\x01',L'\0');
  iVar4 = local_268 + L'\xfffffffe';
  wVar7 = iVar10 + iVar3 + L'\xffffffff';
  draw_rectangle(c,local_268 + L'\xfffffffd',x1 + L'\x01',local_268 + L'\x03',wVar7,L'\x15',L'\v',
                 false);
  generate_hole(c,local_268 + L'\xfffffffd',x1 + L'\x01',local_268 + L'\x03',wVar7,L'\x02');
  set_pit_type(c->depth,L'\x02');
  event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,dun->pit_type->name);
  wVar7 = dun->pit_type->obj_rarity;
  get_mon_num_prep(mon_pit_hook);
  bVar8 = false;
  for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 1) {
    pmVar6 = get_mon_num(c->depth + L'\n',c->depth);
    what[lVar9] = pmVar6;
    bVar8 = (bool)(bVar8 | pmVar6 == (monster_race *)0x0);
  }
  _Var1 = false;
  get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
  if (!bVar8) {
    if ((player->opts).opt[0x18] == true) {
      msg("Monster nest (%s)",dun->pit_type->name);
    }
    add_to_monster_rating(c,uVar2 + dun->pit_type->ave / 0x14);
    for (; iVar11 = x1 + L'\x02', iVar4 <= local_268 + L'\x02'; iVar4 = iVar4 + 1) {
      for (; iVar11 <= iVar10 + iVar3 + L'\xfffffffe'; iVar11 = iVar11 + 1) {
        uVar2 = Rand_div(0x40);
        grid.y = iVar4;
        grid.x = iVar11;
        place_new_monster(c,grid,what[(int)uVar2],false,false,(monster_group_info)0x0,'\f');
        wVar5 = Rand_div(100);
        if (wVar5 < wVar7) {
          wVar5 = c->depth;
          uVar2 = Rand_div(3);
          place_object((chunk_conflict *)c,grid,wVar5 + L'\n',uVar2 == 0,false,'\x04',L'\0');
        }
      }
    }
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool build_nest(struct chunk *c, struct loc centre, int rating)
{
	struct loc grid;
	int y1, x1, y2, x2;
	int i;
	int alloc_obj;
	struct monster_race *what[64];
	bool empty = false;
	int light = false;
	int size_vary = randint0(4);
	int height = 9;
	int width = 11 + 2 * size_vary;
	struct monster_group_info info = {0, 0};

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);

	/* Generate outer walls */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);

	/* Generate inner floors */
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* Advance to the center room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls; add one door as entrance */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);
	generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

	/* Decide on the pit type */
	set_pit_type(c->depth, 2);
	event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, dun->pit_type->name);

	/* Chance of objects on the floor */
	alloc_obj = dun->pit_type->obj_rarity;
	
	/* Prepare allocation table */
	get_mon_num_prep(mon_pit_hook);

	/* Pick some monster types */
	for (i = 0; i < 64; i++) {
		/* Get a (hard) monster type */
		what[i] = get_mon_num(c->depth + 10, c->depth);

		/* Notice failure */
		if (!what[i]) empty = true;
	}

	/* Prepare allocation table */
	get_mon_num_prep(NULL);

	/* Oops */
	if (empty) return false;

	/* Describe */
	ROOM_LOG("Monster nest (%s)", dun->pit_type->name);

	/* Increase the level rating */
	add_to_monster_rating(c, size_vary + dun->pit_type->ave / 20);

	/* Place some monsters */
	for (grid.y = y1; grid.y <= y2; grid.y++) {
		for (grid.x = x1; grid.x <= x2; grid.x++) {
			/* Figure out what monster is being used, and place that monster */
			struct monster_race *race = what[randint0(64)];
			place_new_monster(c, grid, race, false, false, info,
							  ORIGIN_DROP_PIT);

			/* Occasionally place an item, making it good 1/3 of the time */
			if (randint0(100) < alloc_obj) 
				place_object(c, grid, c->depth + 10, one_in_(3), false,
							 ORIGIN_PIT, 0);
		}
	}

	return true;
}